

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

xmlChar * xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt)

{
  xmlChar *cur;
  uint uVar1;
  xmlChar *pxVar2;
  xmlChar xVar3;
  int code;
  xmlChar *utf;
  int len;
  int local_2c;
  
  pxVar2 = ctxt->cur;
  xVar3 = *pxVar2;
  if (xVar3 != '\"') {
    if (xVar3 != '\'') {
      code = 3;
LAB_001c745c:
      xmlXPathErr(ctxt,code);
      return (xmlChar *)0x0;
    }
    xVar3 = '\'';
  }
  cur = pxVar2 + 1;
  ctxt->cur = cur;
  utf = cur;
  if (xVar3 != pxVar2[1]) {
    do {
      local_2c = 4;
      if (*utf == '\0') {
        code = 2;
        goto LAB_001c745c;
      }
      uVar1 = xmlGetUTF8Char(utf,&local_2c);
      code = 0x15;
      if ((int)uVar1 < 0) goto LAB_001c745c;
      if (uVar1 < 0x100) {
        if (((0xd < (byte)uVar1) || ((0x2600U >> (uVar1 & 0x1f) & 1) == 0)) && (uVar1 < 0x20))
        goto LAB_001c745c;
      }
      else if (0xfffff < uVar1 - 0x10000 && (0x1ffd < uVar1 - 0xe000 && 0xd7ff < uVar1))
      goto LAB_001c745c;
      pxVar2 = ctxt->cur;
      utf = pxVar2 + local_2c;
      ctxt->cur = utf;
    } while (xVar3 != pxVar2[local_2c]);
  }
  pxVar2 = xmlStrndup(cur,(int)utf - (int)cur);
  if (pxVar2 == (xmlChar *)0x0) {
    xmlXPathPErrMemory(ctxt);
  }
  if (*ctxt->cur != '\0') {
    ctxt->cur = ctxt->cur + 1;
  }
  return pxVar2;
}

Assistant:

static xmlChar *
xmlXPathParseLiteral(xmlXPathParserContextPtr ctxt) {
    const xmlChar *q;
    xmlChar *ret = NULL;
    int quote;

    if (CUR == '"') {
        quote = '"';
    } else if (CUR == '\'') {
        quote = '\'';
    } else {
	XP_ERRORNULL(XPATH_START_LITERAL_ERROR);
    }

    NEXT;
    q = CUR_PTR;
    while (CUR != quote) {
        int ch;
        int len = 4;

        if (CUR == 0)
            XP_ERRORNULL(XPATH_UNFINISHED_LITERAL_ERROR);
        ch = xmlGetUTF8Char(CUR_PTR, &len);
        if ((ch < 0) || (IS_CHAR(ch) == 0))
            XP_ERRORNULL(XPATH_INVALID_CHAR_ERROR);
        CUR_PTR += len;
    }
    ret = xmlStrndup(q, CUR_PTR - q);
    if (ret == NULL)
        xmlXPathPErrMemory(ctxt);
    NEXT;
    return(ret);
}